

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool httplib::detail::read_headers(Stream *strm,Headers *headers)

{
  size_t sVar1;
  pointer pcVar2;
  size_t sVar3;
  undefined1 uVar4;
  int iVar5;
  int extraout_var;
  _Alloc_hider _Var6;
  stream_line_reader *psVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  Stream local_888;
  char buf [2048];
  stream_line_reader line_reader;
  char byte;
  
  psVar7 = (stream_line_reader *)&line_reader.fixed_buffer_used_size_;
  line_reader.strm_ = &local_888;
  line_reader.fixed_buffer_ = (char *)0x800;
  line_reader.fixed_buffer_used_size_ = (size_t)&line_reader.glowable_buffer_._M_string_length;
  line_reader.fixed_buffer_size_ = 0;
  line_reader.glowable_buffer_._M_dataplus._M_p = (pointer)0x0;
  line_reader.glowable_buffer_._M_string_length._0_1_ = 0;
  lVar8 = 0;
  do {
    iVar5 = (*strm->_vptr_Stream[4])
                      (strm,(undefined1 *)((long)&line_reader.glowable_buffer_.field_2 + 0xf),1);
    sVar3 = line_reader.fixed_buffer_size_;
    if (extraout_var < 0) {
      bVar10 = false;
      bVar9 = false;
    }
    else if (CONCAT44(extraout_var,iVar5) == 0) {
      bVar9 = lVar8 != 0;
      bVar10 = false;
    }
    else {
      if (line_reader.fixed_buffer_size_ < line_reader.fixed_buffer_ + -1) {
        sVar1 = line_reader.fixed_buffer_size_ + 1;
        line_reader.fixed_buffer_size_ = sVar1;
        *(char *)((long)&(line_reader.strm_)->_vptr_Stream + sVar3) =
             line_reader.glowable_buffer_.field_2._M_local_buf[0xf];
        *(undefined1 *)((long)&(line_reader.strm_)->_vptr_Stream + sVar1) = 0;
      }
      else {
        if (line_reader.glowable_buffer_._M_dataplus._M_p == (pointer)0x0) {
          std::__cxx11::string::_M_replace((ulong)psVar7,0,(char *)0x0,(ulong)line_reader.strm_);
        }
        std::__cxx11::string::push_back((char)psVar7);
      }
      bVar10 = line_reader.glowable_buffer_.field_2._M_local_buf[0xf] != '\n';
      bVar9 = true;
    }
    lVar8 = lVar8 + -1;
  } while (bVar10);
  if (bVar9) {
    _Var6._M_p = line_reader.glowable_buffer_._M_dataplus._M_p;
    if (line_reader.glowable_buffer_._M_dataplus._M_p == (pointer)0x0) {
      _Var6._M_p = (pointer)line_reader.fixed_buffer_size_;
    }
    if (line_reader.glowable_buffer_._M_dataplus._M_p == (pointer)0x0) {
      psVar7 = &line_reader;
    }
    lVar8 = 3;
    if ((pointer)0x1 < _Var6._M_p) {
      pcVar2 = _Var6._M_p + (long)&psVar7->strm_->_vptr_Stream;
      if ((((pcVar2[-2] == '\r') && (pcVar2[-1] == '\n')) && (lVar8 = 2, _Var6._M_p != (pointer)0x2)
          ) && (lVar8 = 1, _Var6._M_p < (pointer)0x2001)) {
        lVar8 = 0;
        parse_header<httplib::detail::read_headers(httplib::Stream&,std::multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)::_lambda(std::__cxx11::string&&,std::__cxx11::string&&)_1_>
                  ((char *)psVar7->strm_,pcVar2 + -2,(anon_class_8_1_b2c1a266)headers);
      }
    }
    uVar4 = (*(code *)((long)&DAT_001f696c + (long)(int)(&DAT_001f696c)[lVar8]))();
    return (bool)uVar4;
  }
  if ((size_type *)line_reader.fixed_buffer_used_size_ !=
      &line_reader.glowable_buffer_._M_string_length) {
    operator_delete((void *)line_reader.fixed_buffer_used_size_,
                    CONCAT71(line_reader.glowable_buffer_._M_string_length._1_7_,
                             (undefined1)line_reader.glowable_buffer_._M_string_length) + 1);
  }
  return false;
}

Assistant:

inline bool read_headers(Stream& strm, Headers& headers) {
            const auto bufsiz = 2048;
            char buf[bufsiz];
            stream_line_reader line_reader(strm, buf, bufsiz);

            for (;;) {
                if (!line_reader.getline()) { return false; }

                // Check if the line ends with CRLF.
                auto line_terminator_len = 2;
                if (line_reader.end_with_crlf()) {
                    // Blank line indicates end of headers.
                    if (line_reader.size() == 2) { break; }
                #ifdef CPPHTTPLIB_ALLOW_LF_AS_LINE_TERMINATOR
                } else {
                    // Blank line indicates end of headers.
                    if (line_reader.size() == 1) { break; }
                    line_terminator_len = 1;
                }
            #else
            } else {
                    continue; // Skip invalid line.
                }